

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSimSat.c
# Opt level: O0

void Ssw_ManResimulateBit(Ssw_Man_t *p,Aig_Obj_t *pCand,Aig_Obj_t *pRepr)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  abctime aVar8;
  Aig_Obj_t *pAVar9;
  void *pvVar10;
  Aig_Obj_t *pAVar11;
  abctime aVar12;
  abctime clk;
  int RetValue2;
  int RetValue1;
  int i;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pRepr_local;
  Aig_Obj_t *pCand_local;
  Ssw_Man_t *p_local;
  
  aVar8 = Abc_Clock();
  pAVar9 = Aig_ManConst1(p->pAig);
  *(ulong *)&pAVar9->field_0x18 = *(ulong *)&pAVar9->field_0x18 & 0xffffffffffffffdf | 0x20;
  for (RetValue2 = 0; iVar3 = Vec_PtrSize(p->pAig->vCis), RetValue2 < iVar3;
      RetValue2 = RetValue2 + 1) {
    pvVar10 = Vec_PtrEntry(p->pAig->vCis,RetValue2);
    uVar4 = Abc_InfoHasBit(p->pPatWords,RetValue2);
    *(ulong *)((long)pvVar10 + 0x18) =
         *(ulong *)((long)pvVar10 + 0x18) & 0xffffffffffffffdf | ((ulong)uVar4 & 1) << 5;
  }
  for (RetValue2 = 0; iVar3 = Vec_PtrSize(p->pAig->vObjs), RetValue2 < iVar3;
      RetValue2 = RetValue2 + 1) {
    pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,RetValue2);
    if ((pAVar9 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar9), iVar3 != 0)) {
      pAVar11 = Aig_ObjFanin0(pAVar9);
      uVar1 = *(ulong *)&pAVar11->field_0x18;
      uVar4 = Aig_ObjFaninC0(pAVar9);
      pAVar11 = Aig_ObjFanin1(pAVar9);
      uVar2 = *(ulong *)&pAVar11->field_0x18;
      uVar5 = Aig_ObjFaninC1(pAVar9);
      *(ulong *)&pAVar9->field_0x18 =
           *(ulong *)&pAVar9->field_0x18 & 0xffffffffffffffdf |
           ((ulong)(((uint)(uVar1 >> 5) & 1 ^ uVar4) & ((uint)(uVar2 >> 5) & 1 ^ uVar5)) & 1) << 5;
    }
  }
  if (pRepr != (Aig_Obj_t *)0x0) {
    iVar3 = Ssw_ClassesRefineConst1(p->ppClasses,0);
    iVar6 = Ssw_ClassesRefine(p->ppClasses,0);
    iVar7 = Aig_ObjIsConst1(pRepr);
    if (iVar7 == 0) {
      if (iVar6 == 0) {
        __assert_fail("RetValue2",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSimSat.c"
                      ,0x49,"void Ssw_ManResimulateBit(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      if (iVar6 == 0) {
        Abc_Print(1,"\nSsw_ManResimulateBit() Error: RetValue2 does not hold.\n");
      }
    }
    else {
      if (iVar3 == 0) {
        __assert_fail("RetValue1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSimSat.c"
                      ,0x43,"void Ssw_ManResimulateBit(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      if (iVar3 == 0) {
        Abc_Print(1,"\nSsw_ManResimulateBit() Error: RetValue1 does not hold.\n");
      }
    }
  }
  aVar12 = Abc_Clock();
  p->timeSimSat = (aVar12 - aVar8) + p->timeSimSat;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Handle the counter-example.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_ManResimulateBit( Ssw_Man_t * p, Aig_Obj_t * pCand, Aig_Obj_t * pRepr )
{
    Aig_Obj_t * pObj;
    int i, RetValue1, RetValue2;
    abctime clk = Abc_Clock();
    // set the PI simulation information
    Aig_ManConst1(p->pAig)->fMarkB = 1;
    Aig_ManForEachCi( p->pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit( p->pPatWords, i );
    // simulate internal nodes
    Aig_ManForEachNode( p->pAig, pObj, i )
        pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                     & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
    // if repr is given, perform refinement
    if ( pRepr )
    {
        // check equivalence classes
        RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 0 );
        RetValue2 = Ssw_ClassesRefine( p->ppClasses, 0 );
        // make sure refinement happened
        if ( Aig_ObjIsConst1(pRepr) )
        {
            assert( RetValue1 );
            if ( RetValue1 == 0 )
                Abc_Print( 1, "\nSsw_ManResimulateBit() Error: RetValue1 does not hold.\n" );
        }
        else
        {
            assert( RetValue2 );
            if ( RetValue2 == 0 )
                Abc_Print( 1, "\nSsw_ManResimulateBit() Error: RetValue2 does not hold.\n" );
        }
    }
p->timeSimSat += Abc_Clock() - clk;
}